

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O2

void __thiscall Clasp::Cli::JsonOutput::startWitness(JsonOutput *this,double time)

{
  ulong uVar1;
  
  uVar1 = (this->objStack_)._M_string_length;
  if ((uVar1 < 3) || ((this->objStack_)._M_dataplus._M_p[uVar1 - 1] != '[')) {
    pushObject(this,"Witnesses",type_array,false);
  }
  pushObject(this,(char *)0x0,type_object,false);
  printTime(this,"Time",time);
  return;
}

Assistant:

void JsonOutput::startWitness(double time) {
	if (!hasWitnesses()) {
		pushObject("Witnesses", type_array);
	}
	pushObject();
	printTime("Time", time);
}